

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::IOException::IOException<unsigned_long,unsigned_long>
          (IOException *this,string *msg,unsigned_long params,unsigned_long params_1)

{
  unsigned_long in_RCX;
  string *in_RDX;
  IOException *in_RDI;
  string local_40 [24];
  unsigned_long in_stack_ffffffffffffffd8;
  
  Exception::ConstructMessage<unsigned_long,unsigned_long>(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  duckdb::IOException::IOException(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}